

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O2

DFA<covenant::Sym> * __thiscall
covenant::CycleBreakingAbstract<covenant::Sym>::do_abstraction
          (DFA<covenant::Sym> *__return_storage_ptr__,CycleBreakingAbstract<covenant::Sym> *this,
          CFG *g,bool is_regular)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  string *this_00;
  sp_counted_base *__n;
  void *__buf;
  CycleBreaking<covenant::Sym> transformer;
  DFA<covenant::Sym> sfa;
  string local_530 [32];
  string local_510 [32];
  CFG str_reg_cfg;
  shared_count local_468;
  DFA<covenant::Sym> dfa;
  CFG local_298;
  CFG local_218;
  CFG local_198;
  CFG local_118;
  DFA<covenant::Sym> local_98;
  
  sfa._tfac.px = (g->_tfac).px;
  __n = (g->_tfac).pn.pi_;
  if (__n == (sp_counted_base *)0x0) {
    sfa._tfac.pn.pi_ = (sp_counted_base *)0x0;
  }
  else {
    LOCK();
    __n->use_count_ = __n->use_count_ + 1;
    UNLOCK();
    LOCK();
    __n->use_count_ = __n->use_count_ + 1;
    UNLOCK();
    sfa._tfac.pn.pi_ = __n;
  }
  sfa.start = 0;
  sfa.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  sfa.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  sfa.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  sfa.trans.
  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sfa.trans.
  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sfa.trans.
  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sfa.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sfa.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sfa.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  sfa.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  sfa.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_4_ = 0;
  sfa.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._4_8_ = 0;
  local_468.pi_ = __n;
  boost::detail::shared_count::~shared_count(&local_468);
  if (is_regular) {
    if (avy::AvyLogFlag != '\0') {
      std::__cxx11::string::string((string *)&dfa,"verbose",(allocator *)&str_reg_cfg);
      sVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)avy::AvyLog_abi_cxx11_,(key_type *)&dfa);
      std::__cxx11::string::~string((string *)&dfa);
      if (sVar2 != 0) {
        std::operator<<((ostream *)&std::cout,"The CFG is regular thus no need to abstract.\n");
      }
    }
    CFG::CFG(&local_118,g);
    StronglyRegularToFA<covenant::Sym>::StronglyRegularToFA
              ((StronglyRegularToFA<covenant::Sym> *)&dfa,&local_118);
    CFG::~CFG(&local_118);
    StronglyRegularToFA<covenant::Sym>::make_fa
              ((DFA<covenant::Sym> *)&str_reg_cfg,(StronglyRegularToFA<covenant::Sym> *)&dfa);
    DFA<covenant::Sym>::operator=(&sfa,(DFA<covenant::Sym> *)&str_reg_cfg);
    DFA<covenant::Sym>::~DFA((DFA<covenant::Sym> *)&str_reg_cfg);
    StronglyRegularToFA<covenant::Sym>::~StronglyRegularToFA
              ((StronglyRegularToFA<covenant::Sym> *)&dfa);
  }
  else {
    if (avy::AvyLogFlag != '\0') {
      std::__cxx11::string::string((string *)&dfa,"verbose",(allocator *)&str_reg_cfg);
      sVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)avy::AvyLog_abi_cxx11_,(key_type *)&dfa);
      std::__cxx11::string::~string((string *)&dfa);
      if (sVar2 != 0) {
        std::operator<<((ostream *)&std::cout,"Applied cycle breaking abstraction.\n");
      }
    }
    CFG::CFG(&local_198,g);
    CycleBreaking<covenant::Sym>::Approximate(&str_reg_cfg,&transformer,&local_198);
    CFG::~CFG(&local_198);
    if (avy::AvyLogFlag == '\x01') {
      std::__cxx11::string::string((string *)&dfa,"abstraction",(allocator *)&local_98);
      sVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)avy::AvyLog_abi_cxx11_,(key_type *)&dfa);
      std::__cxx11::string::~string((string *)&dfa);
      if (sVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Approximated regular grammar:\n");
        CFG::CFG(&local_218,&str_reg_cfg);
        CFG::write(&local_218,(int)poVar3,__buf,(size_t)__n);
        CFG::~CFG(&local_218);
      }
    }
    CFG::CFG(&local_298,&str_reg_cfg);
    StronglyRegularToFA<covenant::Sym>::StronglyRegularToFA
              ((StronglyRegularToFA<covenant::Sym> *)&dfa,&local_298);
    CFG::~CFG(&local_298);
    StronglyRegularToFA<covenant::Sym>::make_fa
              (&local_98,(StronglyRegularToFA<covenant::Sym> *)&dfa);
    DFA<covenant::Sym>::operator=(&sfa,&local_98);
    DFA<covenant::Sym>::~DFA(&local_98);
    StronglyRegularToFA<covenant::Sym>::~StronglyRegularToFA
              ((StronglyRegularToFA<covenant::Sym> *)&dfa);
    CFG::~CFG(&str_reg_cfg);
  }
  DFA<covenant::Sym>::eps_elim(&sfa);
  DFA<covenant::Sym>::makeDFA(&dfa,&sfa,g->alphstart,g->alphsz);
  DFA<covenant::Sym>::minimize(__return_storage_ptr__,&dfa,g->alphstart,g->alphsz);
  bVar1 = DFA<covenant::Sym>::eliminateDeadStates(__return_storage_ptr__);
  if (bVar1) {
    DFA<covenant::Sym>::~DFA(&dfa);
    DFA<covenant::Sym>::~DFA(&sfa);
    return __return_storage_ptr__;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  if (is_regular) {
    std::__cxx11::string::string
              (local_510,"One CFG is trivially empty.\n======\nUNSAT\n======",
               (allocator *)&str_reg_cfg);
    std::__cxx11::string::string(this_00,local_510);
    __cxa_throw(this_00,&Exit::typeinfo,Exit::~Exit);
  }
  std::__cxx11::string::string
            (local_530,"One CFG is empty after abstraction.\n======\nUNSAT\n======",
             (allocator *)&str_reg_cfg);
  std::__cxx11::string::string(this_00,local_530);
  __cxa_throw(this_00,&Exit::typeinfo,Exit::~Exit);
}

Assistant:

DFA<EdgeSym> do_abstraction(CFG &g, const bool is_regular)
  {
    bool is_abs_done = false;
    DFA<EdgeSym> sfa (g.getTermFactory ());
    if (is_regular)
    {        
      LOG( "verbose", cout << "The CFG is regular thus no need to abstract.\n");

      StronglyRegularToFA<EdgeSym>  conv(g);
      sfa = conv.make_fa();
    }
    else
    {
      LOG( "verbose" , cout << "Applied cycle breaking abstraction.\n");
      is_abs_done = true;
      CycleBreaking<EdgeSym> transformer;
      CFG str_reg_cfg = transformer.Approximate(g);

      LOG ("abstraction" , 
           cout << "Approximated regular grammar:\n" << str_reg_cfg);

      StronglyRegularToFA<EdgeSym> conv(str_reg_cfg);
      sfa = conv.make_fa();
    }

    /// Simplify the automata
    sfa.eps_elim();

    DFA<EdgeSym> dfa     = sfa.makeDFA (g.alphstart, g.alphsz);
    DFA<EdgeSym> min_dfa = dfa.minimize (g.alphstart, g.alphsz);
    bool is_not_empty    = min_dfa.eliminateDeadStates();
    if (!is_not_empty)
    {
      if  (!is_abs_done) 
        throw Exit("One CFG is trivially empty.\n======\nUNSAT\n======");
      else
        throw Exit("One CFG is empty after abstraction.\n======\nUNSAT\n======");
    }
    return min_dfa;
  }